

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void xmlInitParserInternal(void)

{
  xmlInitRandom();
  xmlInitMemoryInternal();
  xmlInitRMutex(&xmlLibraryLock);
  xmlInitGlobalsInternal();
  xmlInitDictInternal();
  xmlInitEncodingInternal();
  xmlInitXPathInternal();
  xmlInitIOCallbacks();
  xmlInitCatalogInternal();
  xmlParserInitialized = 1;
  return;
}

Assistant:

static void
xmlInitParserInternal(void) {
    /*
     * Note that the initialization code must not make memory allocations.
     */
    xmlInitRandom(); /* Required by xmlInitGlobalsInternal */
    xmlInitMemoryInternal();
    xmlInitThreadsInternal();
    xmlInitGlobalsInternal();
    xmlInitDictInternal();
    xmlInitEncodingInternal();
#if defined(LIBXML_XPATH_ENABLED)
    xmlInitXPathInternal();
#endif
    xmlInitIOCallbacks();
#ifdef LIBXML_CATALOG_ENABLED
    xmlInitCatalogInternal();
#endif

    xmlParserInitialized = 1;
}